

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QRhiGles2::gatherSamplers
          (QRhiGles2 *this,GLuint program,InOutVariable *v,QGles2SamplerDescriptionVector *dst)

{
  long lVar1;
  GLint GVar2;
  QVarLengthArray<QGles2SamplerDescription,_4LL> *in_RCX;
  QOpenGLFunctions *in_RDX;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  QGles2SamplerDescription sampler;
  undefined4 in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::constData((QByteArray *)0x92aeb3);
  GVar2 = QOpenGLFunctions::glGetUniformLocation
                    (in_RDX,(GLuint)((ulong)in_RCX >> 0x20),
                     (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
  if (-1 < GVar2) {
    QVarLengthArray<QGles2SamplerDescription,_4LL>::append
              (in_RCX,(QGles2SamplerDescription *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiGles2::gatherSamplers(GLuint program,
                               const QShaderDescription::InOutVariable &v,
                               QGles2SamplerDescriptionVector *dst)
{
    QGles2SamplerDescription sampler;
    sampler.glslLocation = f->glGetUniformLocation(program, v.name.constData());
    if (sampler.glslLocation >= 0) {
        sampler.combinedBinding = v.binding;
        sampler.tbinding = -1;
        sampler.sbinding = -1;
        dst->append(sampler);
    }
}